

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O0

double sdf::SDF(Vector3d *location,
               vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  bool bVar1;
  reference ppPVar2;
  double *pdVar3;
  double extraout_XMM0_Qa;
  Transform<double,_3,_2,_0> *extraout_XMM0_Qa_00;
  EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  Vector3d location_warped;
  const_iterator it;
  double d_value;
  TransformTraits in_stack_00000174;
  Transform<double,_3,_2,_0> *in_stack_00000178;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  operation_t in_stack_ffffffffffffff14;
  double local_e8;
  EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff20;
  Transform<double,_3,_2,_0> *in_stack_ffffffffffffff28;
  undefined1 local_40 [24];
  Primitive **local_28;
  __normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
  local_20;
  double local_18 [3];
  
  local_18[0] = 0.0;
  local_20._M_current =
       (Primitive **)
       std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::begin
                 (in_stack_ffffffffffffff08);
  while( true ) {
    local_28 = (Primitive **)
               std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::end
                         (in_stack_ffffffffffffff08);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (__normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
    ::operator[](&local_20,0);
    Eigen::Transform<double,_3,_2,_0>::inverse(in_stack_00000178,in_stack_00000174);
    Eigen::Transform<double,3,2,0>::operator*(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::begin
              (in_stack_ffffffffffffff08);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (__normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                        *)in_stack_ffffffffffffff08);
    if (bVar1) {
      ppPVar2 = __gnu_cxx::
                __normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                ::operator[](&local_20,0);
      (**(*ppPVar2)->_vptr_Primitive)(*ppPVar2,local_40);
      local_18[0] = extraout_XMM0_Qa;
    }
    else {
      ppPVar2 = __gnu_cxx::
                __normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                ::operator[](&local_20,0);
      in_stack_ffffffffffffff14 = (*ppPVar2)->operation;
      if (in_stack_ffffffffffffff14 == bool_union) {
        ppPVar2 = __gnu_cxx::
                  __normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                  ::operator[](&local_20,0);
        (**(*ppPVar2)->_vptr_Primitive)(*ppPVar2,local_40);
        in_stack_ffffffffffffff28 = extraout_XMM0_Qa_00;
        pdVar3 = std::min<double>((double *)&stack0xffffffffffffff28,local_18);
        local_18[0] = *pdVar3;
      }
      else if (in_stack_ffffffffffffff14 == bool_subtraction) {
        ppPVar2 = __gnu_cxx::
                  __normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                  ::operator[](&local_20,0);
        (**(*ppPVar2)->_vptr_Primitive)(*ppPVar2,local_40);
        local_e8 = -extraout_XMM0_Qa_02;
        pdVar3 = std::max<double>(&local_e8,local_18);
        local_18[0] = *pdVar3;
      }
      else if (in_stack_ffffffffffffff14 == bool_intersection) {
        ppPVar2 = __gnu_cxx::
                  __normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
                  ::operator[](&local_20,0);
        (**(*ppPVar2)->_vptr_Primitive)(*ppPVar2,local_40);
        in_stack_ffffffffffffff20 = extraout_XMM0_Qa_01;
        pdVar3 = std::max<double>((double *)&stack0xffffffffffffff20,local_18);
        local_18[0] = *pdVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<sdf::Primitive_*const_*,_std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>_>
    ::operator++(&local_20);
  }
  return local_18[0];
}

Assistant:

double 
  SDF(const Eigen::Vector3d &location, const std::vector<Primitive*> &primitives)
  {
    double d_value = 0.0;

    for(std::vector<Primitive*>::const_iterator it = primitives.begin(); it != primitives.end(); ++it)
    {
      Eigen::Vector3d location_warped = it[0]->transformation.inverse()*location;
      if( it == primitives.begin() ) d_value = it[0]->signedDistance(location_warped);
      else
      {
        switch(it[0]->operation)
        {
          case bool_union :
            d_value = std::min( it[0]->signedDistance(location_warped), d_value);
          
            break;
          case bool_intersection :
            d_value = std::max( it[0]->signedDistance(location_warped), d_value);
            break;
          
          case bool_subtraction :
            d_value = std::max( -it[0]->signedDistance(location_warped), d_value);
            break;
        } 
      }
    }
    return d_value;
  }